

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorOperations.cpp
# Opt level: O3

void __thiscall
helics::BinaryTranslatorOperation::BinaryTranslatorOperation(BinaryTranslatorOperation *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_TranslatorOperations)._vptr_TranslatorOperations =
       (_func_int **)&PTR__BinaryTranslatorOperation_0054c370;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0054c640;
  p_Var1[1]._M_use_count = 1;
  p_Var1[1]._M_weak_count = 0;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__TranslatorOperator_0054c400;
  (this->to).super___shared_ptr<helics::BinaryTranslatorOperator,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  (this->to).super___shared_ptr<helics::BinaryTranslatorOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)(p_Var1 + 1);
  return;
}

Assistant:

BinaryTranslatorOperation::BinaryTranslatorOperation():
    to(std::make_shared<BinaryTranslatorOperator>())
{
}